

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat.h
# Opt level: O2

int __thiscall
wasm::Flat::verifyFlatness::VerifyFlatness::verify
          (VerifyFlatness *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  ostream *poVar1;
  int in_EAX;
  Fatal *this_00;
  undefined1 local_1b0 [399];
  char local_21;
  
  if ((int)ctx != 0) {
    return in_EAX;
  }
  Fatal::Fatal((Fatal *)local_1b0);
  poVar1 = (ostream *)(local_1b0 + 0x10);
  std::operator<<(poVar1,"IR must be flat: run --flatten beforehand (");
  std::operator<<(poVar1,(char *)sig);
  std::operator<<(poVar1,", in ");
  this_00 = Fatal::operator<<((Fatal *)local_1b0,
                              (Name *)(this->
                                      super_PostWalker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>
                                      ).
                                      super_Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>
                                      .currFunction);
  local_21 = ')';
  Fatal::operator<<(this_00,&local_21);
  Fatal::~Fatal((Fatal *)local_1b0);
}

Assistant:

void verify(bool condition, const char* message) {
      if (!condition) {
        Fatal() << "IR must be flat: run --flatten beforehand (" << message
                << ", in " << getFunction()->name << ')';
      }
    }